

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O2

void * Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::GetAuxPtr
                 (FunctionProxy *host,AuxPointerType e)

{
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *this;
  void *pvVar1;
  
  this = (host->auxPtrs).ptr;
  if (this->count == '\x03') {
    pvVar1 = AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'_',_(unsigned_char)'\x03'>
             ::Get((AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)___,_(unsigned_char)__x03_>
                    *)this,e);
    return pvVar1;
  }
  if (this->count == '\x01') {
    pvVar1 = AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'\x10',_(unsigned_char)'\x01'>
             ::Get((AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
                    *)this,e);
    return pvVar1;
  }
  if ((ulong)this->offsets[e] == 0xff) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = this->ptrs[this->offsets[e]].ptr;
  }
  return pvVar1;
}

Assistant:

inline void* AuxPtrs<T, FieldsEnum>::GetAuxPtr(const T* host, FieldsEnum e)
    {
        auto tmpAuxPtrs = PointerValue(host->auxPtrs);
        if (tmpAuxPtrs->count == AuxPtrs16::MaxCount)
        {
            return ((AuxPtrs16*)(void*)tmpAuxPtrs)->Get(e);
        }
        if (tmpAuxPtrs->count == AuxPtrs32::MaxCount)
        {
            return ((AuxPtrs32*)(void*)tmpAuxPtrs)->Get(e);
        }
        return tmpAuxPtrs->Get(e);
    }